

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evotiming.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int cnum;
  timeval end;
  timeval start;
  int local_54;
  timeval local_50;
  timeval local_40;
  
  local_54 = 0;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    do {
      while (iVar1 = getopt(argc,argv,"c:"), iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_54);
      }
    } while (iVar1 != -1);
    if (local_54 < nva_cardsnum) {
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
      uVar2 = 0;
      if ((ulong)((local_50.tv_usec - local_40.tv_usec) +
                 (local_50.tv_sec - local_40.tv_sec) * 1000000) < 1000000) {
        uVar2 = 0;
        do {
          evosend(local_54,0,0x80,0);
          gettimeofday(&local_50,(__timezone_ptr_t)0x0);
          uVar2 = uVar2 + 1;
        } while ((ulong)((local_50.tv_usec - local_40.tv_usec) +
                        (local_50.tv_sec - local_40.tv_sec) * 1000000) < 1000000);
      }
      printf("%d evo 0x80 commands in 1 sec\n",(ulong)uVar2);
      return 0;
    }
    if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	int c, i;
	int cnum =0;
	struct timeval start, end;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	gettimeofday(&start, NULL);
	gettimeofday(&end, NULL);

	for (i=0 ; time_diff_us(start, end) < 1000000 ; i++) {
		evosend(cnum, 0, 0x80, 0);
		gettimeofday(&end, NULL);
	};

	printf("%d evo 0x80 commands in 1 sec\n", i);
	return 0;
}